

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.c
# Opt level: O1

AddressSpaceDispatch * address_space_dispatch_new_x86_64(uc_struct_conflict *uc,FlatView *fv)

{
  uint16_t uVar1;
  AddressSpaceDispatch *pAVar2;
  MemoryRegionSection *section;
  PhysPageMap local_58;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined1 local_28;
  
  pAVar2 = (AddressSpaceDispatch *)g_malloc0(0x38);
  if (fv == (FlatView *)0x0) {
    __assert_fail("fv",
                  "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                  ,0x579,
                  "uint16_t dummy_section(struct uc_struct *, PhysPageMap *, FlatView *, MemoryRegion *)"
                 );
  }
  local_58.nodes = (Node *)&uc->io_mem_unassigned;
  local_58.nodes_nb = 1;
  local_58.nodes_nb_alloc = 0;
  local_58.sections_nb = 0;
  local_58.sections_nb_alloc = 0;
  local_38 = 0;
  uStack_30 = 0;
  local_28 = 0;
  local_58.sections = (MemoryRegionSection *)fv;
  uVar1 = phys_section_add((uc_struct_conflict *)&pAVar2->map,&local_58,section);
  if (uVar1 == 0) {
    pAVar2->phys_map = (PhysPageEntry)0xffffffc1;
    pAVar2->uc = uc;
    return pAVar2;
  }
  __assert_fail("n == PHYS_SECTION_UNASSIGNED",
                "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/exec.c"
                ,0x5a0,
                "AddressSpaceDispatch *address_space_dispatch_new_x86_64(struct uc_struct *, FlatView *)"
               );
}

Assistant:

AddressSpaceDispatch *address_space_dispatch_new(struct uc_struct *uc, FlatView *fv)
{
    AddressSpaceDispatch *d = g_new0(AddressSpaceDispatch, 1);
#ifndef NDEBUG
    uint16_t n;

    n = dummy_section(uc, &d->map, fv, &(uc->io_mem_unassigned));
    assert(n == PHYS_SECTION_UNASSIGNED);
#else
    dummy_section(uc, &d->map, fv, &(uc->io_mem_unassigned));
#endif

    d->phys_map  = (PhysPageEntry) { .ptr = PHYS_MAP_NODE_NIL, .skip = 1 };
    d->uc = uc;

    return d;
}